

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool mkvparser::MasteringMetadata::Parse
               (IMkvReader *reader,longlong mm_start,longlong mm_size,MasteringMetadata **mm)

{
  bool bVar1;
  MasteringMetadata *this;
  long lVar2;
  long lVar3;
  longlong lVar4;
  bool bVar5;
  MasteringMetadata *chromaticity;
  long stop;
  float fVar6;
  longlong read_pos;
  double value;
  longlong child_size;
  longlong child_id;
  long local_78;
  double local_70;
  longlong local_68;
  longlong local_60;
  MasteringMetadata **local_58;
  MasteringMetadata *local_50;
  MasteringMetadata *local_48;
  MasteringMetadata *local_40;
  MasteringMetadata *local_38;
  
  if ((reader == (IMkvReader *)0x0) || (*mm != (MasteringMetadata *)0x0)) {
    bVar5 = false;
  }
  else {
    local_58 = mm;
    this = (MasteringMetadata *)operator_new(0x28);
    this->r = (PrimaryChromaticity *)0x0;
    this->g = (PrimaryChromaticity *)0x0;
    this->b = (PrimaryChromaticity *)0x0;
    this->white_point = (PrimaryChromaticity *)0x0;
    local_40 = (MasteringMetadata *)&this->b;
    this->luminance_max = 3.4028235e+38;
    this->luminance_min = 3.4028235e+38;
    stop = mm_size + mm_start;
    local_48 = (MasteringMetadata *)&this->white_point;
    local_50 = (MasteringMetadata *)&this->g;
    local_78 = mm_start;
    local_38 = this;
    while( true ) {
      bVar5 = stop <= local_78;
      if (stop <= local_78) {
        *local_58 = this;
        return bVar5;
      }
      local_60 = 0;
      local_68 = 0;
      lVar2 = ParseElementHeader(reader,&local_78,stop,&local_60,&local_68);
      lVar4 = local_68;
      lVar3 = local_78;
      if (lVar2 < 0) break;
      switch(local_60) {
      case 0x55d1:
      case 0x55d2:
        lVar3 = 0x55d1;
        chromaticity = this;
        break;
      case 0x55d3:
      case 0x55d4:
        lVar3 = 0x55d3;
        chromaticity = local_50;
        break;
      case 0x55d5:
      case 0x55d6:
        lVar3 = 0x55d5;
        chromaticity = local_40;
        break;
      case 0x55d7:
      case 0x55d8:
        lVar3 = 0x55d7;
        chromaticity = local_48;
        break;
      case 0x55d9:
        local_70 = 0.0;
        lVar2 = UnserializeFloat(reader,local_78,local_68,&local_70);
        if ((ABS(local_70) <= 3.4028234663852886e+38) &&
           ((local_70 <= 0.0 || (1.1754943508222875e-38 <= local_70)))) {
          fVar6 = (float)local_70;
          this->luminance_max = fVar6;
          if ((-1 < lVar2) && ((0.0 <= fVar6 && (fVar6 <= 9999.99)))) goto LAB_0016033f;
        }
        goto switchD_001602e7_default;
      case 0x55da:
        local_70 = 0.0;
        lVar2 = UnserializeFloat(reader,local_78,local_68,&local_70);
        if ((ABS(local_70) <= 3.4028234663852886e+38) &&
           ((local_70 <= 0.0 || (1.1754943508222875e-38 <= local_70)))) {
          fVar6 = (float)local_70;
          this->luminance_min = fVar6;
          if ((-1 < lVar2) && ((0.0 <= fVar6 && (fVar6 <= 999.9999)))) goto LAB_0016033f;
        }
      default:
        goto switchD_001602e7_default;
      }
      bVar1 = PrimaryChromaticity::Parse
                        (reader,local_78,local_68,local_60 == lVar3,&chromaticity->r);
      lVar4 = local_68;
      lVar3 = local_78;
      if (!bVar1) break;
LAB_0016033f:
      local_78 = lVar3 + lVar4;
      if (stop < local_78) break;
    }
switchD_001602e7_default:
    ~MasteringMetadata(this);
    operator_delete(this);
  }
  return bVar5;
}

Assistant:

bool MasteringMetadata::Parse(IMkvReader* reader, long long mm_start,
                              long long mm_size, MasteringMetadata** mm) {
  if (!reader || *mm)
    return false;

  std::unique_ptr<MasteringMetadata> mm_ptr(new MasteringMetadata());
  if (!mm_ptr.get())
    return false;

  const long long mm_end = mm_start + mm_size;
  long long read_pos = mm_start;

  while (read_pos < mm_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, mm_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvLuminanceMax) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_max = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_max < 0.0 ||
          mm_ptr->luminance_max > 9999.99) {
        return false;
      }
    } else if (child_id == libwebm::kMkvLuminanceMin) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_min = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_min < 0.0 ||
          mm_ptr->luminance_min > 999.9999) {
        return false;
      }
    } else {
      bool is_x = false;
      PrimaryChromaticity** chromaticity;
      switch (child_id) {
        case libwebm::kMkvPrimaryRChromaticityX:
        case libwebm::kMkvPrimaryRChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryRChromaticityX;
          chromaticity = &mm_ptr->r;
          break;
        case libwebm::kMkvPrimaryGChromaticityX:
        case libwebm::kMkvPrimaryGChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryGChromaticityX;
          chromaticity = &mm_ptr->g;
          break;
        case libwebm::kMkvPrimaryBChromaticityX:
        case libwebm::kMkvPrimaryBChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryBChromaticityX;
          chromaticity = &mm_ptr->b;
          break;
        case libwebm::kMkvWhitePointChromaticityX:
        case libwebm::kMkvWhitePointChromaticityY:
          is_x = child_id == libwebm::kMkvWhitePointChromaticityX;
          chromaticity = &mm_ptr->white_point;
          break;
        default:
          return false;
      }
      const bool value_parse_status = PrimaryChromaticity::Parse(
          reader, read_pos, child_size, is_x, chromaticity);
      if (!value_parse_status)
        return false;
    }

    read_pos += child_size;
    if (read_pos > mm_end)
      return false;
  }

  *mm = mm_ptr.release();
  return true;
}